

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
CEAngle::DmsVect(vector<double,_std::allocator<double>_> *__return_storage_ptr__,CEAngle *this)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char sign;
  vector<int,_std::allocator<int>_> DMS_i;
  allocator<int> local_5a;
  char local_59;
  undefined1 local_58 [16];
  value_type_conflict1 local_40;
  vector<int,_std::allocator<int>_> local_38;
  
  local_58._8_8_ = local_58._0_8_;
  local_40 = (value_type_conflict1)((ulong)local_40 & 0xffffffff00000000);
  std::allocator<int>::allocator(&local_5a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,4,(value_type_conflict2 *)&local_40,&local_5a);
  __gnu_cxx::new_allocator<int>::~new_allocator((new_allocator<int> *)&local_5a);
  local_58._0_8_ = this->angle_;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,0);
  iauA2af(local_58._0_4_,9,&local_59,pvVar2);
  local_40 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)&local_5a);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,4,&local_40,(allocator<double> *)&local_5a);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_5a);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,0);
  uVar4 = 0;
  uVar5 = 0;
  dVar1 = (double)*pvVar2;
  if (local_59 == '-') {
    dVar1 = (double)((ulong)dVar1 ^ (ulong)DAT_00151920);
    uVar4 = DAT_00151920._8_4_;
    uVar5 = DAT_00151920._12_4_;
  }
  local_58._8_4_ = uVar4;
  local_58._0_8_ = dVar1;
  local_58._12_4_ = uVar5;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar3 = (value_type)local_58._0_8_;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,1);
  local_58._0_8_ = (double)*pvVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar3 = (value_type)local_58._0_8_;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,2);
  local_58._0_8_ = (undefined8)*pvVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  *pvVar3 = (value_type)local_58._0_8_;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,3);
  local_58._0_8_ = (double)*pvVar2 * 1e-09;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,3);
  *pvVar3 = (value_type)local_58._0_8_;
  std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CEAngle::DmsVect(void) const
{
    // Variables for holding the results
    char sign;
    std::vector<int> DMS_i(4, 0.0);

    // Run the appropriate SOFA value
    iauA2af(9, angle_, &sign, &DMS_i[0]);

    // Fill the values into a double vector
    std::vector<double> DMS_d(4, 0.0);
    DMS_d[0] = DMS_i[0] * (sign == '-' ? -1.0 : 1.0);
    DMS_d[1] = DMS_i[1];
    DMS_d[2] = DMS_i[2];
    DMS_d[3] = DMS_i[3] * 1.0e-9;

    return DMS_d ;
}